

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void v1v2_alo_alr_format_text(la_vstring *vstr,void *data,int indent,la_miam_core_pdu_type pdu_type)

{
  char *pcVar1;
  int in_ECX;
  uint in_EDX;
  la_vstring *in_RSI;
  la_vstring *in_RDI;
  la_miam_core_v1v2_alo_alr_pdu *pdu;
  int in_stack_ffffffffffffffdc;
  la_vstring *vstr_00;
  
  if ((in_ECX == 2) || (in_ECX == 3)) {
    if ((in_RSI->len & 0xffff) == 0) {
      vstr_00 = in_RSI;
      la_vstring_append_sprintf
                (in_RDI,"%*sPDU Length: %u\n",(ulong)in_EDX,"",
                 (ulong)*(uint *)((long)&in_RSI->len + 4));
      la_vstring_append_sprintf
                (in_RDI,"%*sAircraft ID: %s\n",(ulong)in_EDX,"",
                 (undefined1 *)((long)&in_RSI->allocated_size + 4));
      pcVar1 = "comp_selected";
      if (in_ECX == 2) {
        pcVar1 = "comp_supported";
      }
      la_vstring_append_sprintf(in_RDI,"%*sCompressions %s:\n",(ulong)in_EDX,"",pcVar1 + 5);
      la_miam_bitmask_format_text
                (vstr_00,(uint8_t)(in_EDX >> 0x18),(la_dict *)in_RSI,in_stack_ffffffffffffffdc);
      la_vstring_append_sprintf(in_RDI,"%*sNetworks supported:\n",(ulong)in_EDX,"");
      la_miam_bitmask_format_text
                (vstr_00,(uint8_t)(in_EDX >> 0x18),(la_dict *)in_RSI,in_stack_ffffffffffffffdc);
    }
    else {
      la_miam_errors_format_text(in_RSI,in_EDX,in_ECX);
    }
  }
  return;
}

Assistant:

static void v1v2_alo_alr_format_text(la_vstring *vstr, void const *data, int indent,
		la_miam_core_pdu_type pdu_type) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);
	la_assert(indent >= 0);

	if(pdu_type != LA_MIAM_CORE_PDU_ALO && pdu_type != LA_MIAM_CORE_PDU_ALR) {
		return;
	}

	la_miam_core_v1v2_alo_alr_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	LA_ISPRINTF(vstr, indent, "PDU Length: %u\n", pdu->pdu_len);
	LA_ISPRINTF(vstr, indent, "Aircraft ID: %s\n", pdu->aircraft_id);
	LA_ISPRINTF(vstr, indent, "Compressions %s:\n",
			(pdu_type == LA_MIAM_CORE_PDU_ALO ? "supported" : "selected"));
	la_miam_bitmask_format_text(vstr, pdu->compression,
			la_miam_core_v1v2_alo_alr_compression_names, indent + 1);
	LA_ISPRINTF(vstr, indent, "Networks supported:\n");
	la_miam_bitmask_format_text(vstr, pdu->networks,
			la_miam_core_v1v2_alo_alr_network_names, indent + 1);
	// Not checking for body errors here, as there is no body in ALO and ALR PDUs
}